

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>_>::GetItemQuery
          (CrossSiteObject<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>_> *this,
          Var originalInstance,uint32 index,Var *value,ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  Var pvVar2;
  
  pvVar2 = CrossSite::MarshalVar
                     ((((((Type *)((long)&(this->
                                          super_FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>
                                          ).super_ScriptFunctionWithInlineCache.super_ScriptFunction
                                          .super_ScriptFunctionBase.super_JavascriptFunction.
                                          super_DynamicObject.super_RecyclableObject + 8))->ptr->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                      originalInstance,false);
  PVar1 = DynamicObject::GetItemQuery((DynamicObject *)this,pvVar2,index,value,requestContext);
  if (PVar1 == Property_Found) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return PVar1;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetItemQuery(originalInstance, index, value, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }